

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_forgetful_chain_inc.h
# Opt level: O0

void InitH42(MemoryManager *m,H42 *self,uint8_t *data,BrotliEncoderParams *params,size_t position,
            size_t bytes,int is_last)

{
  int iVar1;
  size_t kMaxBytesForPartialHashInit;
  size_t bytes_local;
  size_t position_local;
  BrotliEncoderParams *params_local;
  uint8_t *data_local;
  H42 *self_local;
  MemoryManager *m_local;
  
  iVar1 = 8;
  if (6 < params->quality) {
    iVar1 = 7;
  }
  self->max_hops = (ulong)(uint)(iVar1 << ((char)params->quality - 4U & 0x1f));
  if (((position == 0) && (is_last != 0)) && (bytes < 0x201)) {
    InitForDataH42(self,data,bytes);
  }
  else {
    InitEmptyH42(self);
  }
  return;
}

Assistant:

static void FN(Init)(
    MemoryManager* m, HashForgetfulChain* self, const uint8_t* data,
    const BrotliEncoderParams* params, size_t position, size_t bytes,
    BROTLI_BOOL is_last) {
  /* Choose which initialization method is faster.
     Init() is about 100 times faster than InitForData(). */
  const size_t kMaxBytesForPartialHashInit = BUCKET_SIZE >> 6;
  BROTLI_UNUSED(m);
  self->max_hops = (params->quality > 6 ? 7u : 8u) << (params->quality - 4);
  if (position == 0 && is_last && bytes <= kMaxBytesForPartialHashInit) {
    FN(InitForData)(self, data, bytes);
  } else {
    FN(InitEmpty)(self);
  }
}